

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *p,int iFrame,abctime Time)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pObj_00;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  int local_34;
  int nOutDigits;
  int i;
  Aig_Obj_t *pObj;
  abctime Time_local;
  int iFrame_local;
  Ssw_RarMan_t *p_local;
  
  p->iFailPo = -1;
  p->iFailPat = -1;
  local_34 = 0;
  do {
    iVar1 = Saig_ManPoNum(p->pAig);
    if ((iVar1 <= local_34) ||
       ((pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,local_34), p->pAig->nConstrs != 0 &&
        (iVar1 = Saig_ManPoNum(p->pAig), iVar1 - p->pAig->nConstrs <= local_34))))
    goto LAB_0088011b;
    if (((p->vCexes == (Vec_Ptr_t *)0x0) ||
        (pvVar5 = Vec_PtrEntry(p->vCexes,local_34), pvVar5 == (void *)0x0)) &&
       (iVar1 = Ssw_RarManPoIsConst0(p,pObj_00), iVar1 == 0)) {
      p->iFailPo = local_34;
      iVar1 = Ssw_RarManObjWhichOne(p,pObj_00);
      p->iFailPat = iVar1;
      if (p->pPars->fSolveAll == 0) {
LAB_0088011b:
        p_local._4_4_ = (uint)(-1 < p->iFailPo);
        return p_local._4_4_;
      }
      p->pPars->nSolved = p->pPars->nSolved + 1;
      if (p->vCexes == (Vec_Ptr_t *)0x0) {
        iVar1 = Saig_ManPoNum(p->pAig);
        pVVar6 = Vec_PtrStart(iVar1);
        p->vCexes = pVVar6;
      }
      pvVar5 = Vec_PtrEntry(p->vCexes,local_34);
      if (pvVar5 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry(p->vCexes, i) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x26b,"int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *, int, abctime)");
      }
      Vec_PtrWriteEntry(p->vCexes,local_34,(void *)0x1);
      if ((p->pPars->pFuncOnFail != (_func_int_int_Abc_Cex_t_ptr *)0x0) &&
         (iVar1 = (*p->pPars->pFuncOnFail)(local_34,(Abc_Cex_t *)0x0), iVar1 != 0)) {
        return 2;
      }
      if (p->pPars->fNotVerbose == 0) {
        uVar2 = Saig_ManPoNum(p->pAig);
        uVar3 = Abc_Base10Log(uVar2);
        uVar2 = p->iFailPo;
        iVar1 = p->pPars->nSolved;
        iVar4 = Saig_ManPoNum(p->pAig);
        Abc_Print(1,"Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ",
                  (ulong)uVar3,(ulong)uVar2,(ulong)(uint)iFrame,(ulong)uVar3,iVar1,uVar3,iVar4);
        Abc_PrintTime(1,"Time",Time);
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int Ssw_RarManCheckNonConstOutputs( Ssw_RarMan_t * p, int iFrame, abctime Time )
{
    Aig_Obj_t * pObj;
    int i;
    p->iFailPo  = -1;
    p->iFailPat = -1;
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        if ( p->pAig->nConstrs && i >= Saig_ManPoNum(p->pAig) - p->pAig->nConstrs )
            break;
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        if ( Ssw_RarManPoIsConst0(p, pObj) )
            continue;
        p->iFailPo  = i;
        p->iFailPat = Ssw_RarManObjWhichOne( p, pObj );
        if ( !p->pPars->fSolveAll )
            break;
        // remember the one solved
        p->pPars->nSolved++;
        if ( p->vCexes == NULL )
            p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        assert( Vec_PtrEntry(p->vCexes, i) == NULL );
        Vec_PtrWriteEntry( p->vCexes, i, (void *)(ABC_PTRINT_T)1 );
        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(i, NULL) )
            return 2; // quitting due to callback
        // print final report
        if ( !p->pPars->fNotVerbose )
        {
            int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
            Abc_Print( 1, "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ", 
                nOutDigits, p->iFailPo, iFrame, 
                nOutDigits, p->pPars->nSolved, 
                nOutDigits, Saig_ManPoNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Time );
        }
    }
    if ( p->iFailPo >= 0 ) // found CEX
        return 1;
    else
        return 0;
}